

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001df730 = 0x2d2d2d2d2d2d2d;
    uRam00000000001df737._0_1_ = '-';
    uRam00000000001df737._1_1_ = '-';
    uRam00000000001df737._2_1_ = '-';
    uRam00000000001df737._3_1_ = '-';
    uRam00000000001df737._4_1_ = '-';
    uRam00000000001df737._5_1_ = '-';
    uRam00000000001df737._6_1_ = '-';
    uRam00000000001df737._7_1_ = '-';
    DAT_001df720 = '-';
    DAT_001df720_1._0_1_ = '-';
    DAT_001df720_1._1_1_ = '-';
    DAT_001df720_1._2_1_ = '-';
    DAT_001df720_1._3_1_ = '-';
    DAT_001df720_1._4_1_ = '-';
    DAT_001df720_1._5_1_ = '-';
    DAT_001df720_1._6_1_ = '-';
    uRam00000000001df728 = 0x2d2d2d2d2d2d2d;
    DAT_001df72f = 0x2d;
    DAT_001df710 = '-';
    DAT_001df710_1._0_1_ = '-';
    DAT_001df710_1._1_1_ = '-';
    DAT_001df710_1._2_1_ = '-';
    DAT_001df710_1._3_1_ = '-';
    DAT_001df710_1._4_1_ = '-';
    DAT_001df710_1._5_1_ = '-';
    DAT_001df710_1._6_1_ = '-';
    uRam00000000001df718._0_1_ = '-';
    uRam00000000001df718._1_1_ = '-';
    uRam00000000001df718._2_1_ = '-';
    uRam00000000001df718._3_1_ = '-';
    uRam00000000001df718._4_1_ = '-';
    uRam00000000001df718._5_1_ = '-';
    uRam00000000001df718._6_1_ = '-';
    uRam00000000001df718._7_1_ = '-';
    DAT_001df700 = '-';
    DAT_001df700_1._0_1_ = '-';
    DAT_001df700_1._1_1_ = '-';
    DAT_001df700_1._2_1_ = '-';
    DAT_001df700_1._3_1_ = '-';
    DAT_001df700_1._4_1_ = '-';
    DAT_001df700_1._5_1_ = '-';
    DAT_001df700_1._6_1_ = '-';
    uRam00000000001df708._0_1_ = '-';
    uRam00000000001df708._1_1_ = '-';
    uRam00000000001df708._2_1_ = '-';
    uRam00000000001df708._3_1_ = '-';
    uRam00000000001df708._4_1_ = '-';
    uRam00000000001df708._5_1_ = '-';
    uRam00000000001df708._6_1_ = '-';
    uRam00000000001df708._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001df6f8._0_1_ = '-';
    uRam00000000001df6f8._1_1_ = '-';
    uRam00000000001df6f8._2_1_ = '-';
    uRam00000000001df6f8._3_1_ = '-';
    uRam00000000001df6f8._4_1_ = '-';
    uRam00000000001df6f8._5_1_ = '-';
    uRam00000000001df6f8._6_1_ = '-';
    uRam00000000001df6f8._7_1_ = '-';
    DAT_001df73f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}